

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::FilmHandle::WriteImage(FilmHandle *this,ImageMetadata *metadata,Float splatScale)

{
  ulong uVar1;
  RGBFilm *this_00;
  aligned_storage_t<sizeof(float),_alignof(float)> local_118;
  char local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  char local_d0;
  undefined8 local_cc;
  undefined8 uStack_c4;
  undefined8 uStack_bc;
  undefined8 uStack_b4;
  undefined8 uStack_ac;
  undefined8 uStack_a4;
  undefined8 uStack_9c;
  undefined8 uStack_94;
  char local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  char local_78;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_74;
  char local_6c;
  aligned_storage_t<sizeof(int),_alignof(int)> local_68;
  char local_64;
  aligned_storage_t<sizeof(float),_alignof(float)> local_60;
  char local_5c;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_58;
  char local_50;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_48;
  
  uVar1 = (this->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  this_00 = (RGBFilm *)(uVar1 & 0xffffffffffff);
  if (uVar1 >> 0x31 == 0) {
    local_114 = (metadata->renderTimeSeconds).set;
    if ((bool)local_114 == true) {
      local_118.__align =
           *(anon_struct_4_0_00000001_for___align *)&(metadata->renderTimeSeconds).optionalValue;
    }
    local_d0 = (metadata->cameraFromWorld).set;
    if ((bool)local_d0 == true) {
      local_110 = *(undefined8 *)&(metadata->cameraFromWorld).optionalValue;
      uStack_108 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 8);
      uStack_100 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x10);
      uStack_f8 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x18);
      uStack_f0 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x20);
      uStack_e8 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x28);
      uStack_e0 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x30);
      uStack_d8 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x38);
    }
    local_8c = (metadata->NDCFromWorld).set;
    if ((bool)local_8c == true) {
      local_cc = *(undefined8 *)&(metadata->NDCFromWorld).optionalValue;
      uStack_c4 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 8);
      uStack_bc = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x10);
      uStack_b4 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x18);
      uStack_ac = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x20);
      uStack_a4 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x28);
      uStack_9c = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x30);
      uStack_94 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x38);
    }
    local_78 = (metadata->pixelBounds).set;
    if ((bool)local_78 == true) {
      local_88 = *(undefined8 *)&(metadata->pixelBounds).optionalValue;
      uStack_80 = *(undefined8 *)((long)&(metadata->pixelBounds).optionalValue + 8);
    }
    local_6c = (metadata->fullResolution).set;
    if ((bool)local_6c == true) {
      local_74 = (metadata->fullResolution).optionalValue;
    }
    local_64 = (metadata->samplesPerPixel).set;
    if ((bool)local_64 == true) {
      local_68 = (metadata->samplesPerPixel).optionalValue;
    }
    local_5c = (metadata->MSE).set;
    if ((bool)local_5c == true) {
      local_60 = (metadata->MSE).optionalValue;
    }
    local_50 = (metadata->colorSpace).set;
    if ((bool)local_50 == true) {
      local_58 = (metadata->colorSpace).optionalValue;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::_Rb_tree(&local_48,&(metadata->stringVectors)._M_t);
    RGBFilm::WriteImage(this_00,(ImageMetadata *)&local_118.__align,splatScale);
  }
  else {
    local_114 = (metadata->renderTimeSeconds).set;
    if ((bool)local_114 == true) {
      local_118.__align =
           *(anon_struct_4_0_00000001_for___align *)&(metadata->renderTimeSeconds).optionalValue;
    }
    local_d0 = (metadata->cameraFromWorld).set;
    if ((bool)local_d0 == true) {
      local_110 = *(undefined8 *)&(metadata->cameraFromWorld).optionalValue;
      uStack_108 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 8);
      uStack_100 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x10);
      uStack_f8 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x18);
      uStack_f0 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x20);
      uStack_e8 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x28);
      uStack_e0 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x30);
      uStack_d8 = *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x38);
    }
    local_8c = (metadata->NDCFromWorld).set;
    if ((bool)local_8c == true) {
      local_cc = *(undefined8 *)&(metadata->NDCFromWorld).optionalValue;
      uStack_c4 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 8);
      uStack_bc = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x10);
      uStack_b4 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x18);
      uStack_ac = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x20);
      uStack_a4 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x28);
      uStack_9c = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x30);
      uStack_94 = *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x38);
    }
    local_78 = (metadata->pixelBounds).set;
    if ((bool)local_78 == true) {
      local_88 = *(undefined8 *)&(metadata->pixelBounds).optionalValue;
      uStack_80 = *(undefined8 *)((long)&(metadata->pixelBounds).optionalValue + 8);
    }
    local_6c = (metadata->fullResolution).set;
    if ((bool)local_6c == true) {
      local_74 = (metadata->fullResolution).optionalValue;
    }
    local_64 = (metadata->samplesPerPixel).set;
    if ((bool)local_64 == true) {
      local_68 = (metadata->samplesPerPixel).optionalValue;
    }
    local_5c = (metadata->MSE).set;
    if ((bool)local_5c == true) {
      local_60 = (metadata->MSE).optionalValue;
    }
    local_50 = (metadata->colorSpace).set;
    if ((bool)local_50 == true) {
      local_58 = (metadata->colorSpace).optionalValue;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::_Rb_tree(&local_48,&(metadata->stringVectors)._M_t);
    GBufferFilm::WriteImage((GBufferFilm *)this_00,(ImageMetadata *)&local_118.__align,splatScale);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void FilmHandle::WriteImage(ImageMetadata metadata, Float splatScale) {
    auto write = [&](auto ptr) { return ptr->WriteImage(metadata, splatScale); };
    return DispatchCPU(write);
}